

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestPicker::testEvenDisabled(TestPicker *this)

{
  QPoint pos;
  Object *obj;
  long lVar1;
  char cVar2;
  undefined8 uVar3;
  QPoint pos_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_188;
  int iStack_184;
  double local_178;
  double local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  QArrayDataPointer<char16_t> local_158;
  double local_138;
  double dStack_130;
  undefined8 local_120;
  StringListEvenDisabledModel model;
  QMouseEvent me;
  QSignalSpy spy;
  
  StringListEvenDisabledModel::StringListEvenDisabledModel(&model,(QObject *)0x0);
  QStringListModel::setStringList((QList *)&model);
  QtMWidgets::Picker::setModel((this->m_picker).value,(QAbstractItemModel *)&model);
  QtMWidgets::Picker::setCurrentIndex((this->m_picker).value,3);
  obj = (this->m_picker).value;
  lVar1 = *(long *)&obj->field_0x20;
  uVar3 = *(undefined8 *)(lVar1 + 0x1c);
  local_168 = *(undefined8 *)(lVar1 + 0x14);
  uStack_160 = 0;
  QSignalSpy::QSignalSpy<void(QtMWidgets::Picker::*)(int)>(&spy,obj,0x168758);
  local_188 = (int)uVar3;
  iStack_184 = (int)((ulong)uVar3 >> 0x20);
  iVar6 = ((local_188 - (int)local_168) + 1) / 2;
  iVar7 = ((iStack_184 - local_168._4_4_) + 1) / 2;
  pos.yp = iVar7;
  pos.xp = iVar6;
  QTest::mousePress(&((this->m_picker).value)->super_QWidget,LeftButton,(KeyboardModifiers)0x0,pos,
                    -1);
  iVar4 = (this->m_delta).xp + iVar6;
  iVar5 = (this->m_delta).yp + iVar7;
  local_120 = CONCAT44(iVar5,iVar4);
  local_138 = (double)iVar4;
  dStack_130 = (double)iVar5;
  uVar3 = QWidget::mapToGlobal((QPoint *)(this->m_picker).value);
  local_178 = (double)(int)uVar3;
  local_170 = (double)(int)((ulong)uVar3 >> 0x20);
  local_158.d = (Data *)0x0;
  local_158.ptr = (char16_t *)0x0;
  local_158.size = 0;
  uVar3 = QPointingDevice::primaryPointingDevice((QString *)&local_158);
  QMouseEvent::QMouseEvent(&me,5,&local_138,&local_178,1,1,0,uVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
  QCoreApplication::sendEvent((QObject *)(this->m_picker).value,(QEvent *)&me);
  QTest::qWait(500);
  pos_00.xp = iVar6 + (this->m_delta).xp;
  pos_00.yp = iVar7 + (this->m_delta).yp;
  QTest::mouseRelease(&((this->m_picker).value)->super_QWidget,LeftButton,(KeyboardModifiers)0x0,
                      pos_00,0x14);
  QTest::mouseClick(&((this->m_picker).value)->super_QWidget,LeftButton,(KeyboardModifiers)0x0,pos,
                    0x14);
  cVar2 = QTest::qVerify(spy.super_QList<QList<QVariant>_>.d.size == 0,"spy.count() == 0","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/picker/main.cpp"
                         ,0xce);
  if (cVar2 != '\0') {
    QtMWidgets::Picker::setModel((this->m_picker).value,(QAbstractItemModel *)&this->m_model);
  }
  QMouseEvent::~QMouseEvent(&me);
  QSignalSpy::~QSignalSpy(&spy);
  QStringListModel::~QStringListModel(&model.super_QStringListModel);
  return;
}

Assistant:

void testEvenDisabled()
	{
		StringListEvenDisabledModel model;
		model.setStringList( m_data );

		m_picker->setModel( &model );

		m_picker->setCurrentIndex( 3 );

		QPoint c( m_picker->width() / 2, m_picker->height() / 2 );

		QSignalSpy spy( m_picker.data(), QOverload< int >::of(
			&QtMWidgets::Picker::currentIndexChanged ) );

		QTest::mousePress( m_picker.data(), Qt::LeftButton, {}, c );
		QMouseEvent me( QEvent::MouseMove, c + m_delta, m_picker->mapToGlobal( c + m_delta ),
			Qt::LeftButton, Qt::LeftButton, {} );
		QApplication::sendEvent( m_picker.data(), &me );
		QTest::qWait( 500 );
		QTest::mouseRelease( m_picker.data(), Qt::LeftButton, {}, c + m_delta, 20 );
		QTest::mouseClick( m_picker.data(), Qt::LeftButton, {}, c, 20 );

		QVERIFY( spy.count() == 0 );

		m_picker->setModel( &m_model );
	}